

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::SoPlexBase<double>::getRowViolation
          (SoPlexBase<double> *this,double *maxviol,double *sumviol)

{
  SPxLPBase<double> *pSVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  double dVar6;
  VectorBase<double> activity;
  VectorBase<double> local_48;
  
  if ((this->_hasSolReal != true) || (bVar3 = true, ((this->_solReal).field_0x98 & 1) == 0)) {
    if (this->_hasSolRational == true) {
      bVar3 = (bool)((this->_solRational).field_0xd0 & 1);
    }
    else {
      bVar3 = false;
    }
  }
  if (bVar3 != false) {
    if ((this->_hasSolReal == false) && (this->_hasSolRational != false)) {
      SolBase<double>::operator=(&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
    VectorBase<double>::VectorBase
              (&local_48,
               (this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    (*(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x46])
              (this->_realLP,&this->_solReal,&local_48,1);
    *maxviol = 0.0;
    *sumviol = 0.0;
    lVar4 = (long)(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    if (0 < lVar4) {
      do {
        pSVar1 = this->_realLP;
        if (pSVar1->_isScaled == true) {
          (*pSVar1->lp_scaler->_vptr_SPxScaler[0x1f])
                    (pSVar1->lp_scaler,pSVar1,(ulong)((int)lVar4 - 1));
          dVar6 = extraout_XMM0_Qa;
        }
        else {
          dVar6 = (pSVar1->super_LPRowSetBase<double>).left.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar4 + -1];
        }
        pSVar1 = this->_realLP;
        if (pSVar1->_isScaled == true) {
          (*pSVar1->lp_scaler->_vptr_SPxScaler[0x1d])
                    (pSVar1->lp_scaler,pSVar1,(ulong)((int)lVar4 - 1));
          dVar5 = extraout_XMM0_Qa_00;
        }
        else {
          dVar5 = (pSVar1->super_LPRowSetBase<double>).right.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar4 + -1];
        }
        dVar6 = dVar6 - local_48.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4 + -1];
        if ((0.0 < dVar6) && (*sumviol = *sumviol + dVar6, *maxviol <= dVar6 && dVar6 != *maxviol))
        {
          *maxviol = dVar6;
        }
        dVar5 = local_48.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4 + -1] - dVar5;
        if ((0.0 < dVar5) && (*sumviol = *sumviol + dVar5, *maxviol <= dVar5 && dVar5 != *maxviol))
        {
          *maxviol = dVar5;
        }
        bVar2 = 1 < lVar4;
        lVar4 = lVar4 + -1;
      } while (bVar2);
    }
    if (local_48.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
  }
  return bVar3;
}

Assistant:

bool SoPlexBase<R>::getRowViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   VectorBase<R> activity(numRows());
   _realLP->computePrimalActivity(primal, activity, true);
   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numRows() - 1; i >= 0; i--)
   {
      R lhs = _realLP->lhsUnscaled(i);
      R rhs = _realLP->rhsUnscaled(i);

      R viol = lhs - activity[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = activity[i] - rhs;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}